

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelPackage.cpp
# Opt level: O0

ModelPackageItemInfo __thiscall
MPL::detail::ModelPackageImpl::createFile
          (ModelPackageImpl *this,string *name,string *author,string *description)

{
  bool bVar1;
  byte bVar2;
  runtime_error *prVar3;
  element_type *peVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  string *in_R8;
  ModelPackageItemInfo MVar5;
  undefined1 local_3c0 [16];
  string local_3b0;
  undefined1 local_390 [8];
  string identifier;
  string local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  ofstream local_328 [8];
  ofstream stream;
  path local_128;
  undefined1 local_100 [8];
  path dstPath;
  path filePath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [24];
  string *description_local;
  string *author_local;
  string *name_local;
  ModelPackageImpl *this_local;
  
  local_40._16_8_ = in_R8;
  description_local = description;
  author_local = author;
  name_local = name;
  this_local = this;
  findItem((ModelPackageImpl *)local_40,name,author);
  bVar1 = std::operator!=((shared_ptr<MPL::ModelPackageItemInfo> *)local_40,(nullptr_t)0x0);
  std::shared_ptr<MPL::ModelPackageItemInfo>::~shared_ptr
            ((shared_ptr<MPL::ModelPackageItemInfo> *)local_40);
  if (bVar1) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_a0,"The package already contains a file with name: ",author_local);
    std::operator+(&local_80,&local_a0," author: ");
    std::operator+(&local_60,&local_80,description_local);
    std::runtime_error::runtime_error(prVar3,(string *)&local_60);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  getItemPath((path *)&dstPath._M_cmpts,(ModelPackageImpl *)name,author_local,description_local);
  std::filesystem::__cxx11::operator/
            ((path *)local_100,(path *)&name[2].field_2,(path *)&dstPath._M_cmpts);
  std::filesystem::__cxx11::path::parent_path();
  std::filesystem::create_directories(&local_128);
  std::filesystem::__cxx11::path::~path(&local_128);
  std::ofstream::ofstream<std::filesystem::__cxx11::path,std::filesystem::__cxx11::path>
            (local_328,(path *)local_100,_S_bin);
  bVar2 = std::ofstream::is_open();
  if ((bVar2 & 1) == 0) {
    identifier.field_2._M_local_buf[0xf] = '\x01';
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::filesystem::__cxx11::path::string(&local_368,(path *)local_100);
    std::operator+(&local_348,"Failed to create file at path: ",&local_368);
    std::runtime_error::runtime_error(prVar3,(string *)&local_348);
    identifier.field_2._M_local_buf[0xf] = '\0';
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  generateIdentifier_abi_cxx11_((string *)local_390,(ModelPackageImpl *)name);
  std::filesystem::__cxx11::path::string((string *)(local_3c0 + 0x10),(path *)&dstPath._M_cmpts);
  createItemInfoEntry((ModelPackageImpl *)name,(string *)local_390,(string *)(local_3c0 + 0x10),
                      author_local,description_local,(string *)local_40._16_8_);
  std::__cxx11::string::~string((string *)(local_3c0 + 0x10));
  findItem((ModelPackageImpl *)local_3c0,name);
  peVar4 = std::
           __shared_ptr_access<MPL::ModelPackageItemInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<MPL::ModelPackageItemInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_3c0);
  ModelPackageItemInfo::ModelPackageItemInfo((ModelPackageItemInfo *)this,peVar4);
  std::shared_ptr<MPL::ModelPackageItemInfo>::~shared_ptr
            ((shared_ptr<MPL::ModelPackageItemInfo> *)local_3c0);
  std::__cxx11::string::~string((string *)local_390);
  std::ofstream::~ofstream(local_328);
  std::filesystem::__cxx11::path::~path((path *)local_100);
  std::filesystem::__cxx11::path::~path((path *)&dstPath._M_cmpts);
  MVar5.m_modelPackageItemInfoImpl.
  super___shared_ptr<MPL::detail::ModelPackageItemInfoImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  MVar5.m_modelPackageItemInfoImpl.
  super___shared_ptr<MPL::detail::ModelPackageItemInfoImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ModelPackageItemInfo)
         MVar5.m_modelPackageItemInfoImpl.
         super___shared_ptr<MPL::detail::ModelPackageItemInfoImpl,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ModelPackageItemInfo ModelPackageImpl::createFile(const std::string& name, const std::string& author, const std::string& description) {
    
    if (findItem(name, author) != nullptr) {
        throw std::runtime_error("The package already contains a file with name: " + name + " author: " + author);
    }
    
    auto filePath = getItemPath(name, author);
    auto dstPath = m_packageDataDirPath / filePath;
    
    create_directories(dstPath.parent_path());
        
    std::ofstream stream(dstPath, std::ios::binary);
    if (!stream.is_open()) {
        throw std::runtime_error("Failed to create file at path: " + dstPath.string());
    }
    
    auto identifier = generateIdentifier();
    createItemInfoEntry(identifier, filePath.string(), name, author, description);
    return *(findItem(identifier));
}